

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void skip_nl(c2m_ctx_t c2m_ctx,token_t t,VARR_token_t *buffer)

{
  if (t != (token_t)0x0) goto LAB_00160d63;
  while( true ) {
    t = get_next_pptoken(c2m_ctx);
LAB_00160d63:
    if ((*(short *)t == 10) || (*(short *)t == 0x147)) break;
    if (buffer != (VARR_token_t *)0x0) {
      VARR_token_tpush(buffer,t);
    }
  }
  unget_next_pptoken(c2m_ctx,t);
  return;
}

Assistant:

static void skip_nl (c2m_ctx_t c2m_ctx, token_t t,
                     VARR (token_t) * buffer) { /* skip until new line */
  if (t == NULL) t = get_next_pptoken (c2m_ctx);
  for (; t->code != '\n' && t->code != T_EOU; t = get_next_pptoken (c2m_ctx))  // ??>
    if (buffer != NULL) VARR_PUSH (token_t, buffer, t);
  unget_next_pptoken (c2m_ctx, t);
}